

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O3

Uint64 __thiscall
Diligent::CommandQueueVkImpl::Submit(CommandQueueVkImpl *this,VkSubmitInfo *InSubmitInfo)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppVVar2;
  SpinLock *this_00;
  Uint64 UVar3;
  SoftwareQueueIndex CommandQueueId;
  pointer ppVVar4;
  VkSemaphore_T *pVVar5;
  iterator iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  VkResult VVar12;
  SyncPointVk *this_02;
  VkSubmitInfo *pVVar13;
  VkSemaphore_T **__args;
  long lVar14;
  ulong uVar15;
  FenceVkImpl *this_03;
  NativeType *ppVVar16;
  string msg_1;
  string msg;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  pthread_mutex_t *local_b8;
  string local_b0;
  SyncPointVkPtr local_90;
  Uint64 local_80;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  uint32_t uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  uint32_t uStack_40;
  undefined4 uStack_3c;
  pointer local_38;
  
  local_b8 = (pthread_mutex_t *)&this->m_QueueMutex;
  iVar10 = pthread_mutex_lock(local_b8);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  LOCK();
  paVar1 = &this->m_NextFenceValue;
  UVar3 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  this_02 = (SyncPointVk *)
            FixedBlockMemoryAllocator::Allocate
                      (&this->m_SyncPointAllocator,(ulong)this->m_NumCommandQueues * 0x20 + 0x38,
                       "SyncPointVk",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
                       ,0x8c);
  SyncPointVk::SyncPointVk
            (this_02,(SoftwareQueueIndex)(this->m_CommandQueueId).m_Value,
             (uint)this->m_NumCommandQueues,
             (this->m_SyncObjectManager).
             super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,((this->m_LogicalDevice).
                      super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->m_VkDevice,UVar3);
  std::__shared_ptr<Diligent::SyncPointVk,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Diligent::SyncPointVk,Diligent::CommandQueueVkImpl::CreateSyncPoint(unsigned_long)::_lambda(Diligent::SyncPointVk*)_1_,void>
            ((__shared_ptr<Diligent::SyncPointVk,(__gnu_cxx::_Lock_policy)2> *)&local_c8,this_02,
             (anon_class_8_1_0a24c139_for__M_tp)&this->m_SyncPointAllocator);
  peVar7 = local_c8;
  ppVVar4 = (this->m_TempSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar4) {
    (this->m_TempSignalSemaphores).
    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar4;
  }
  bVar9 = local_c8->m_NumSemaphores;
  pVVar13 = InSubmitInfo;
  local_80 = UVar3;
  if (bVar9 != 0) {
    ppVVar16 = &local_c8->m_Semaphores[0].m_VkSyncObject;
    uVar15 = 0;
    do {
      pVVar5 = *ppVVar16;
      if (pVVar5 != (VkSemaphore_T *)0x0) {
        iVar6._M_current =
             (this->m_TempSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_78._0_8_ = pVVar5;
        if (iVar6._M_current ==
            (this->m_TempSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
          _M_realloc_insert<VkSemaphore_T*>
                    ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                     &this->m_TempSignalSemaphores,iVar6,(VkSemaphore_T **)local_78);
          bVar9 = peVar7->m_NumSemaphores;
        }
        else {
          *iVar6._M_current = pVVar5;
          pppVVar2 = &(this->m_TempSignalSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar2 = *pppVVar2 + 1;
        }
      }
      uVar15 = uVar15 + 1;
      ppVVar16 = ppVVar16 + 4;
    } while (uVar15 < bVar9);
  }
  do {
    pVVar13 = (VkSubmitInfo *)pVVar13->pNext;
    if (pVVar13 == (VkSubmitInfo *)0x0) goto LAB_001a9dab;
  } while (pVVar13->sType != VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO);
  if ((this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_TempSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    FormatString<char[60]>
              ((string *)local_78,
               (char (*) [60])"Can not append semaphores when timeline semaphores are used");
    DebugAssertionFailed
              ((Char *)local_78._0_8_,"Submit",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xa8);
    if ((VkSemaphore_T *)local_78._0_8_ != (VkSemaphore_T *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,
                      CONCAT44(local_68._M_allocated_capacity._4_4_,
                               local_68._M_allocated_capacity._0_4_) + 1);
    }
  }
LAB_001a9dab:
  uVar11 = InSubmitInfo->signalSemaphoreCount;
  if (uVar11 != 0) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      __args = (VkSemaphore_T **)((long)InSubmitInfo->pSignalSemaphores + lVar14);
      iVar6._M_current =
           (this->m_TempSignalSemaphores).
           super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->m_TempSignalSemaphores).
          super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
        _M_realloc_insert<VkSemaphore_T*const&>
                  ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                   &this->m_TempSignalSemaphores,iVar6,__args);
        uVar11 = InSubmitInfo->signalSemaphoreCount;
      }
      else {
        *iVar6._M_current = *__args;
        pppVVar2 = &(this->m_TempSignalSemaphores).
                    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppVVar2 = *pppVVar2 + 1;
      }
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 8;
    } while (uVar15 < uVar11);
  }
  local_78._0_8_ = *(undefined8 *)InSubmitInfo;
  local_78._8_4_ = *(undefined4 *)&InSubmitInfo->pNext;
  local_78._12_4_ = *(undefined4 *)((long)&InSubmitInfo->pNext + 4);
  local_68._M_allocated_capacity._0_4_ = InSubmitInfo->waitSemaphoreCount;
  local_68._M_allocated_capacity._4_4_ = *(undefined4 *)&InSubmitInfo->field_0x14;
  local_68._8_4_ = *(undefined4 *)&InSubmitInfo->pWaitSemaphores;
  local_68._12_4_ = *(undefined4 *)((long)&InSubmitInfo->pWaitSemaphores + 4);
  local_58 = *(undefined4 *)&InSubmitInfo->pWaitDstStageMask;
  uStack_54 = *(undefined4 *)((long)&InSubmitInfo->pWaitDstStageMask + 4);
  uStack_50 = InSubmitInfo->commandBufferCount;
  uStack_4c = *(undefined4 *)&InSubmitInfo->field_0x2c;
  local_48 = *(undefined4 *)&InSubmitInfo->pCommandBuffers;
  uStack_44 = *(undefined4 *)((long)&InSubmitInfo->pCommandBuffers + 4);
  uStack_3c = *(undefined4 *)&InSubmitInfo->field_0x3c;
  local_38 = (this->m_TempSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uStack_40 = (uint32_t)
              ((ulong)((long)(this->m_TempSignalSemaphores).
                             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)local_38) >> 3);
  VVar12 = (*vkQueueSubmit)(this->m_VkQueue,
                            SUB14((uStack_50 != 0 || local_68._M_allocated_capacity._0_4_ != 0) ||
                                  uStack_40 != 0,0),(VkSubmitInfo *)local_78,
                            (local_c8->m_Fence).m_VkSyncObject);
  UVar3 = local_80;
  if (VVar12 != VK_SUCCESS) {
    FormatString<char[53]>
              (&local_b0,(char (*) [53])"Failed to submit command buffer to the command queue");
    DebugAssertionFailed
              (local_b0._M_dataplus._M_p,"Submit",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xbe);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  this_03 = (this->m_pFence).m_pObject;
  if (this_03 == (FenceVkImpl *)0x0) {
    FormatString<char[45]>(&local_b0,(char (*) [45])"Command queue fence has not been initialized");
    DebugAssertionFailed
              (local_b0._M_dataplus._M_p,"Submit",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xc1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    this_03 = (this->m_pFence).m_pObject;
  }
  CommandQueueId.m_Value = (this->m_CommandQueueId).m_Value;
  local_90.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c8;
  local_90.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_c0;
  if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_c0->_M_use_count = p_Stack_c0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_c0->_M_use_count = p_Stack_c0->_M_use_count + 1;
    }
  }
  FenceVkImpl::AddPendingSyncPoint(this_03,CommandQueueId,UVar3,&local_90);
  if (local_90.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00 = &this->m_LastSyncPointLock;
  LOCK();
  bVar9 = (this->m_LastSyncPointLock).m_IsLocked._M_base._M_i;
  (this->m_LastSyncPointLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  while (p_Var8 = p_Stack_c0, peVar7 = local_c8, (bVar9 & 1) != 0) {
    Threading::SpinLock::Wait(this_00);
    LOCK();
    bVar9 = (this_00->m_IsLocked)._M_base._M_i;
    (this_00->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
  }
  local_c8 = (element_type *)0x0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (this->m_LastSyncPoint).
            super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_LastSyncPoint).super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar7;
  (this->m_LastSyncPoint).super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var8;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  Threading::SpinLock::unlock(this_00);
  if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
  }
  pthread_mutex_unlock(local_b8);
  return UVar3;
}

Assistant:

Uint64 CommandQueueVkImpl::Submit(const VkSubmitInfo& InSubmitInfo)
{
    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};

    // Increment the value before submitting the buffer to be overly safe
    const uint64_t FenceValue = m_NextFenceValue.fetch_add(1);

    auto NewSyncPoint = CreateSyncPoint(FenceValue);

    m_TempSignalSemaphores.clear();
    NewSyncPoint->GetSemaphores(m_TempSignalSemaphores);

#ifdef DILIGENT_DEBUG
    const VkBaseInStructure* pStruct = static_cast<const VkBaseInStructure*>(InSubmitInfo.pNext);
    for (; pStruct != nullptr;)
    {
        if (pStruct->sType == VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO)
        {
            VERIFY(m_TempSignalSemaphores.empty(), "Can not append semaphores when timeline semaphores are used");
            break;
        }
        pStruct = pStruct->pNext;
    }
#endif

    for (uint32_t s = 0; s < InSubmitInfo.signalSemaphoreCount; ++s)
        m_TempSignalSemaphores.push_back(InSubmitInfo.pSignalSemaphores[s]);

    VkSubmitInfo SubmitInfo         = InSubmitInfo;
    SubmitInfo.signalSemaphoreCount = static_cast<Uint32>(m_TempSignalSemaphores.size());
    SubmitInfo.pSignalSemaphores    = m_TempSignalSemaphores.data();

    const uint32_t SubmitCount =
        (SubmitInfo.waitSemaphoreCount != 0 ||
         SubmitInfo.commandBufferCount != 0 ||
         SubmitInfo.signalSemaphoreCount != 0) ?
        1 :
        0;

    auto err = vkQueueSubmit(m_VkQueue, SubmitCount, &SubmitInfo, NewSyncPoint->GetFence());
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to submit command buffer to the command queue");
    (void)err;

    VERIFY(m_pFence != nullptr, "Command queue fence has not been initialized");
    m_pFence->AddPendingSyncPoint(m_CommandQueueId, FenceValue, NewSyncPoint);

    // Update the last sync point
    {
        Threading::SpinLockGuard SyncPointGuard{m_LastSyncPointLock};
        m_LastSyncPoint = std::move(NewSyncPoint);
    }

    return FenceValue;
}